

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

int32 rw::d3d8::getStride(uint32 flags,int32 numTex)

{
  undefined4 local_14;
  int32 stride;
  int32 numTex_local;
  uint32 flags_local;
  
  local_14 = 0xc;
  if ((flags & 0x10) != 0) {
    local_14 = 0x18;
  }
  if ((flags & 8) != 0) {
    local_14 = local_14 + 4;
  }
  return numTex * 8 + local_14;
}

Assistant:

int32
getStride(uint32 flags, int32 numTex)
{
	int32 stride = 12;
	if(flags & Geometry::NORMALS)
		stride += 12;;
	if(flags & Geometry::PRELIT)
		stride += 4;
	stride += numTex*8;
	return stride;
}